

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Configurations::setToDefault(Configurations *this)

{
  string *in_RDI;
  string *in_stack_fffffffffffffd80;
  string *value;
  undefined8 in_stack_fffffffffffffd88;
  allocator *paVar1;
  Configurations *this_00;
  undefined8 in_stack_fffffffffffffdc8;
  undefined1 uVar2;
  ConfigurationType configurationType;
  Configurations *in_stack_fffffffffffffde0;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  undefined1 local_1c9 [40];
  allocator local_1a1;
  string local_1a0 [39];
  undefined1 local_179 [40];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffdc8 >> 0x38);
  paVar1 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"true",paVar1);
  configurationType = (ConfigurationType)((ulong)paVar1 >> 0x20);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  paVar1 = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"true",paVar1);
  uVar2 = (undefined1)((ulong)paVar1 >> 0x38);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"true",&local_89);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"3",&local_b1);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"true",&local_d9);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"0",&local_101);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"0",&local_129);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"%datetime %level [%logger] %msg",&local_151);
  setGlobally(in_stack_fffffffffffffde0,configurationType,in_RDI,(bool)uVar2);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  this_00 = (Configurations *)local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_179 + 1),
             "%datetime %level [%logger] [%user@%host] [%func] [%loc] %msg",(allocator *)this_00);
  set(this_00,(Level)((ulong)in_stack_fffffffffffffd88 >> 0x20),
      (ConfigurationType)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  paVar1 = &local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"%datetime %level [%logger] %msg",paVar1);
  set(this_00,(Level)((ulong)paVar1 >> 0x20),(ConfigurationType)paVar1,in_stack_fffffffffffffd80);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  value = (string *)local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1c9 + 1),"%datetime %level [%logger] %msg",(allocator *)value);
  set(this_00,(Level)((ulong)paVar1 >> 0x20),(ConfigurationType)paVar1,value);
  std::__cxx11::string::~string((string *)(local_1c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"%datetime %level-%vlevel [%logger] %msg",&local_1f1);
  set(this_00,(Level)((ulong)paVar1 >> 0x20),(ConfigurationType)paVar1,value);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_218,"%datetime %level [%logger] [%func] [%loc] %msg",
             (allocator *)&stack0xfffffffffffffde7);
  set(this_00,(Level)((ulong)paVar1 >> 0x20),(ConfigurationType)paVar1,value);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
  return;
}

Assistant:

void Configurations::setToDefault(void) {
  setGlobally(ConfigurationType::Enabled, std::string("true"), true);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
  setGlobally(ConfigurationType::Filename, std::string(base::consts::kDefaultLogFile), true);
#else
  ELPP_UNUSED(base::consts::kDefaultLogFile);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
#if defined(ELPP_NO_LOG_TO_FILE)
  setGlobally(ConfigurationType::ToFile, std::string("false"), true);
#else
  setGlobally(ConfigurationType::ToFile, std::string("true"), true);
#endif // defined(ELPP_NO_LOG_TO_FILE)
  setGlobally(ConfigurationType::ToStandardOutput, std::string("true"), true);
  setGlobally(ConfigurationType::SubsecondPrecision, std::string("3"), true);
  setGlobally(ConfigurationType::PerformanceTracking, std::string("true"), true);
  setGlobally(ConfigurationType::MaxLogFileSize, std::string("0"), true);
  setGlobally(ConfigurationType::LogFlushThreshold, std::string("0"), true);

  setGlobally(ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"), true);
  set(Level::Debug, ConfigurationType::Format,
      std::string("%datetime %level [%logger] [%user@%host] [%func] [%loc] %msg"));
  // INFO and WARNING are set to default by Level::Global
  set(Level::Error, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  set(Level::Fatal, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  set(Level::Verbose, ConfigurationType::Format, std::string("%datetime %level-%vlevel [%logger] %msg"));
  set(Level::Trace, ConfigurationType::Format, std::string("%datetime %level [%logger] [%func] [%loc] %msg"));
}